

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_get_vtable
                    (ma_resampler_config *pConfig,ma_resampler *pResampler,
                    ma_resampling_backend_vtable **ppVTable,void **ppUserData)

{
  void **ppUserData_local;
  ma_resampling_backend_vtable **ppVTable_local;
  ma_resampler *pResampler_local;
  ma_resampler_config *pConfig_local;
  
  *ppVTable = (ma_resampling_backend_vtable *)0x0;
  *ppUserData = (void *)0x0;
  if (pConfig->algorithm == ma_resample_algorithm_linear) {
    *ppVTable = &g_ma_linear_resampler_vtable;
    *ppUserData = pResampler;
  }
  else {
    if (pConfig->algorithm != ma_resample_algorithm_custom) {
      return MA_INVALID_ARGS;
    }
    *ppVTable = pConfig->pBackendVTable;
    *ppUserData = pConfig->pBackendUserData;
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_resampler_get_vtable(const ma_resampler_config* pConfig, ma_resampler* pResampler, ma_resampling_backend_vtable** ppVTable, void** ppUserData)
{
    MA_ASSERT(pConfig    != NULL);
    MA_ASSERT(ppVTable   != NULL);
    MA_ASSERT(ppUserData != NULL);

    /* Safety. */
    *ppVTable   = NULL;
    *ppUserData = NULL;

    switch (pConfig->algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            *ppVTable   = &g_ma_linear_resampler_vtable;
            *ppUserData = pResampler;
        } break;

        case ma_resample_algorithm_custom:
        {
            *ppVTable   = pConfig->pBackendVTable;
            *ppUserData = pConfig->pBackendUserData;
        } break;

        default: return MA_INVALID_ARGS;
    }

    return MA_SUCCESS;
}